

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_UInt16 higher_prime_index(UA_UInt32 n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = 0x1e;
  uVar2 = 0;
  while (uVar5 = uVar2, (UA_UInt16)uVar5 != (UA_UInt16)uVar4) {
    iVar3 = (int)((uVar4 & 0xffff) - (uVar5 & 0xffff)) / 2;
    uVar1 = uVar5 + iVar3;
    if (n <= primes[(ushort)uVar1]) {
      uVar4 = uVar1;
    }
    uVar2 = uVar5 + 1 + iVar3;
    if (n <= primes[(ushort)uVar1]) {
      uVar2 = uVar5;
    }
  }
  return (UA_UInt16)uVar4;
}

Assistant:

static UA_UInt16
higher_prime_index(UA_UInt32 n) {
    UA_UInt16 low  = 0;
    UA_UInt16 high = (UA_UInt16)(sizeof(primes) / sizeof(UA_UInt32));
    while(low != high) {
        UA_UInt16 mid = (UA_UInt16)(low + ((high - low) / 2));
        if(n > primes[mid])
            low = (UA_UInt16)(mid + 1);
        else
            high = mid;
    }
    return low;
}